

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# size.h
# Opt level: O2

Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *
gimage::cropImage<unsigned_short>
          (Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *__return_storage_ptr__,
          Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *image,long x,long y,long w,
          long h)

{
  work_t wVar1;
  long h_00;
  long k;
  long lVar2;
  long i;
  long lVar3;
  int d;
  long lVar4;
  
  if (w < 1) {
    w = 0;
  }
  h_00 = 0;
  if (0 < h) {
    h_00 = h;
  }
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::Image
            (__return_storage_ptr__,w,h_00,image->depth);
  if ((((y | x) < 0) || (image->width < w + x)) || (image->height < y + h_00)) {
    for (lVar4 = 0; lVar4 < image->depth; lVar4 = lVar4 + 1) {
      for (lVar2 = 0; lVar2 != h_00; lVar2 = lVar2 + 1) {
        for (lVar3 = 0; w != lVar3; lVar3 = lVar3 + 1) {
          wVar1 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getBoundsInv
                            (image,x + lVar3,lVar2 + y,(int)lVar4);
          __return_storage_ptr__->img[lVar4][lVar2][lVar3] = (unsigned_short)wVar1;
        }
      }
    }
  }
  else {
    for (lVar4 = 0; lVar4 < image->depth; lVar4 = lVar4 + 1) {
      for (lVar2 = 0; h_00 != lVar2; lVar2 = lVar2 + 1) {
        memcpy(__return_storage_ptr__->img[lVar4][lVar2],image->img[lVar4][y + lVar2] + x,w * 2);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Image<T> cropImage(const Image<T> &image, long x, long y, long w, long h)
{
  w=std::max(0l, w);
  h=std::max(0l, h);

  Image<T> ret(w, h, image.getDepth());

  if (x >= 0 && y >= 0 && x+w <= image.getWidth() && y+h <= image.getHeight())
  {
    for (int d=0; d<image.getDepth(); d++)
    {
      for (long k=0; k<h; k++)
      {
        memcpy(ret.getPtr(0, k, d), image.getPtr(x, y+k, d), w*sizeof(T));
      }
    }
  }
  else
  {
    for (int d=0; d<image.getDepth(); d++)
    {
      for (long k=0; k<h; k++)
      {
        for (long i=0; i<w; i++)
          ret.set(i, k, d,
                  static_cast<typename Image<T>::store_t>(image.getBoundsInv(x+i, y+k, d)));
      }
    }
  }

  return ret;
}